

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O2

Value_BlobFileValue * __thiscall
CoreML::Specification::MILSpec::Value::mutable_blobfilevalue(Value *this)

{
  Value_BlobFileValue *this_00;
  
  if (this->_oneof_case_[0] == 5) {
    this_00 = (Value_BlobFileValue *)(this->value_).immediatevalue_;
  }
  else {
    clear_value(this);
    this->_oneof_case_[0] = 5;
    this_00 = (Value_BlobFileValue *)operator_new(0x28);
    Value_BlobFileValue::Value_BlobFileValue(this_00);
    (this->value_).blobfilevalue_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::MILSpec::Value_BlobFileValue* Value::mutable_blobfilevalue() {
  if (!has_blobfilevalue()) {
    clear_value();
    set_has_blobfilevalue();
    value_.blobfilevalue_ = new ::CoreML::Specification::MILSpec::Value_BlobFileValue;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.MILSpec.Value.blobFileValue)
  return value_.blobfilevalue_;
}